

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

void cmsysProcess_SetPipeNative(cmsysProcess *cp,int prPipe,int *p)

{
  ulong uVar1;
  
  if ((cp != (cmsysProcess *)0x0) && (prPipe - 1U < 3)) {
    uVar1 = (ulong)(prPipe - 1U);
    if (p != (int *)0x0) {
      cp->PipeNativeSTDIN[uVar1 * 2] = *p;
      cp->PipeNativeSTDIN[uVar1 * 2 + 1] = p[1];
      cmsysProcess_SetPipeFile(cp,prPipe,(char *)0x0);
      cmsysProcess_SetPipeShared(cp,prPipe,0);
      return;
    }
    (cp->PipeNativeSTDIN + uVar1 * 2)[0] = -1;
    (cp->PipeNativeSTDIN + uVar1 * 2)[1] = -1;
  }
  return;
}

Assistant:

void kwsysProcess_SetPipeNative(kwsysProcess* cp, int prPipe, int p[2])
{
  int* pPipeNative = 0;

  if(!cp)
    {
    return;
    }

  switch(prPipe)
    {
    case kwsysProcess_Pipe_STDIN: pPipeNative = cp->PipeNativeSTDIN; break;
    case kwsysProcess_Pipe_STDOUT: pPipeNative = cp->PipeNativeSTDOUT; break;
    case kwsysProcess_Pipe_STDERR: pPipeNative = cp->PipeNativeSTDERR; break;
    default: return;
    }

  /* Copy the native pipe descriptors provided.  */
  if(p)
    {
    pPipeNative[0] = p[0];
    pPipeNative[1] = p[1];
    }
  else
    {
    pPipeNative[0] = -1;
    pPipeNative[1] = -1;
    }

  /* If we are using a native pipe, do not share it or redirect it to
     a file.  */
  if(p)
    {
    kwsysProcess_SetPipeFile(cp, prPipe, 0);
    kwsysProcess_SetPipeShared(cp, prPipe, 0);
    }
}